

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman_int.cpp
# Opt level: O1

uint32_t __thiscall Roman_int::as_int(Roman_int *this)

{
  char cVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  string left;
  stringstream ss;
  string local_1f8;
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  long local_1b8 [16];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8,(string *)this,_S_out|_S_in);
  uVar2 = get_M((istream *)local_1b8);
  uVar3 = get_C((istream *)local_1b8);
  uVar4 = get_X((istream *)local_1b8);
  uVar5 = get_I((istream *)local_1b8);
  local_1d0 = 0;
  local_1c8 = 0;
  local_1d8 = &local_1c8;
  cVar1 = std::ios::widen((char)(istream *)local_1b8 + (char)*(undefined8 *)(local_1b8[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1b8,(string *)&local_1d8,cVar1);
  if (local_1d0 != 0) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,"Invalid roman numeral.","");
    error(&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return uVar4 + uVar5 + uVar3 + uVar2;
}

Assistant:

uint32_t Roman_int::as_int() const
{
	std::stringstream ss{ m_numerals };
	auto n = get_M(ss) + get_C(ss) + get_X(ss) + get_I(ss);
	std::string left;
	std::getline(ss, left);
	if (!left.empty())
	{
		error("Invalid roman numeral.");
	}
	return n;
}